

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  LazyDescriptor *pLVar1;
  string *psVar2;
  string *psVar3;
  MethodOptions *pMVar4;
  MethodOptions *pMVar5;
  string local_40;
  
  psVar2 = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  psVar3 = (proto->name_).ptr_;
  if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&proto->name_,psVar2);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  pLVar1 = (LazyDescriptor *)(this + 0x18);
  if (*(GoogleOnceDynamic **)(this + 0x28) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::internal::LazyDescriptor>
              (*(GoogleOnceDynamic **)(this + 0x28),internal::LazyDescriptor::OnceStatic,pLVar1);
  }
  if (pLVar1->descriptor_[0x29] == (Descriptor)0x0) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".","");
    internal::ArenaStringPtr::SetNoArena
              (&proto->input_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               &local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
  if ((proto->input_type_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena
              (&proto->input_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar2 = (proto->input_type_).ptr_;
  if (*(GoogleOnceDynamic **)(this + 0x28) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::internal::LazyDescriptor>
              (*(GoogleOnceDynamic **)(this + 0x28),internal::LazyDescriptor::OnceStatic,pLVar1);
  }
  std::__cxx11::string::_M_append((char *)psVar2,**(ulong **)(*(long *)(this + 0x18) + 8));
  pLVar1 = (LazyDescriptor *)(this + 0x38);
  if (*(GoogleOnceDynamic **)(this + 0x48) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::internal::LazyDescriptor>
              (*(GoogleOnceDynamic **)(this + 0x48),internal::LazyDescriptor::OnceStatic,pLVar1);
  }
  if (pLVar1->descriptor_[0x29] == (Descriptor)0x0) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".","");
    internal::ArenaStringPtr::SetNoArena
              (&proto->output_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               &local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
  if ((proto->output_type_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena
              (&proto->output_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar2 = (proto->output_type_).ptr_;
  if (*(GoogleOnceDynamic **)(this + 0x48) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::internal::LazyDescriptor>
              (*(GoogleOnceDynamic **)(this + 0x48),internal::LazyDescriptor::OnceStatic,pLVar1);
  }
  std::__cxx11::string::_M_append((char *)psVar2,**(ulong **)(*(long *)(this + 0x38) + 8));
  pMVar5 = *(MethodOptions **)(this + 0x58);
  pMVar4 = MethodOptions::default_instance();
  if (pMVar5 != pMVar4) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    if (proto->options_ == (MethodOptions *)0x0) {
      pMVar5 = (MethodOptions *)operator_new(0x70);
      MethodOptions::MethodOptions(pMVar5);
      proto->options_ = pMVar5;
    }
    MethodOptions::CopyFrom(proto->options_,*(MethodOptions **)(this + 0x58));
  }
  if (this[0x60] == (MethodDescriptor)0x1) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x10;
    proto->client_streaming_ = true;
  }
  if (this[0x61] == (MethodDescriptor)0x1) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x20;
    proto->server_streaming_ = true;
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  proto->mutable_input_type()->append(input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  proto->mutable_output_type()->append(output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
}